

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerHLSL::emit_mesh_tasks(CompilerHLSL *this,SPIRBlock *block)

{
  CompilerError *this_00;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if ((block->mesh).payload.id != 0) {
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_a0,&this->super_CompilerGLSL,(block->mesh).groups[0].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_80,&this->super_CompilerGLSL,(block->mesh).groups[1].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_40,&this->super_CompilerGLSL,(block->mesh).groups[2].id,true);
    CompilerGLSL::to_unpacked_expression_abi_cxx11_
              (&local_60,&this->super_CompilerGLSL,(block->mesh).payload.id,true);
    CompilerGLSL::
    statement<char_const(&)[14],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3]>
              (&this->super_CompilerGLSL,(char (*) [14])"DispatchMesh(",&local_a0,
               (char (*) [3])0x3b2a97,&local_80,(char (*) [3])0x3b2a97,&local_40,
               (char (*) [3])0x3b2a97,&local_60,(char (*) [3])0x39d4ef);
    ::std::__cxx11::string::~string((string *)&local_60);
    ::std::__cxx11::string::~string((string *)&local_40);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_a0,"Amplification shader in HLSL must have payload",
             (allocator *)&local_80);
  CompilerError::CompilerError(this_00,&local_a0);
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerHLSL::emit_mesh_tasks(SPIRBlock &block)
{
	if (block.mesh.payload != 0)
	{
		statement("DispatchMesh(", to_unpacked_expression(block.mesh.groups[0]), ", ", to_unpacked_expression(block.mesh.groups[1]), ", ",
		    to_unpacked_expression(block.mesh.groups[2]), ", ", to_unpacked_expression(block.mesh.payload), ");");
	}
	else
	{
		SPIRV_CROSS_THROW("Amplification shader in HLSL must have payload");
	}
}